

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O0

void inc_counter(uchar *counter,size_t counter_bytes)

{
  uchar uVar1;
  uchar c;
  uint n;
  size_t counter_bytes_local;
  uchar *counter_local;
  
  n = (uint)counter_bytes;
  do {
    n = n - 1;
    uVar1 = counter[n];
    counter[n] = uVar1 + '\x01';
    if ((uchar)(uVar1 + '\x01') != '\0') {
      return;
    }
  } while (n != 0);
  return;
}

Assistant:

void inc_counter(unsigned char *counter, size_t counter_bytes)
{
    unsigned int n = counter_bytes;

    do {
        unsigned char c;
        --n;
        c = counter[n];
        ++c;
        counter[n] = c;
        if (c)
            return;
    } while (n);
}